

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O0

int64_t default_now(quicly_now_t *self)

{
  long lVar1;
  long *in_FS_OFFSET;
  int64_t tv_now;
  timeval tv;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  lVar1 = local_18.tv_sec * 1000 + local_18.tv_usec / 1000;
  if (*(long *)(*in_FS_OFFSET + -0x30) < lVar1) {
    *(long *)(*in_FS_OFFSET + -0x30) = lVar1;
  }
  return *(int64_t *)(*in_FS_OFFSET + -0x30);
}

Assistant:

static int64_t default_now(quicly_now_t *self)
{
    struct timeval tv;
    gettimeofday(&tv, NULL);
    int64_t tv_now = (int64_t)tv.tv_sec * 1000 + tv.tv_usec / 1000;

    /* make sure that the time does not get rewind */
    static __thread int64_t now;
    if (now < tv_now)
        now = tv_now;
    return now;
}